

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

PtrTokenOrSyntax * __thiscall
slang::syntax::ContinuousAssignSyntax::getChildPtr
          (PtrTokenOrSyntax *__return_storage_ptr__,ContinuousAssignSyntax *this,size_t index)

{
  __index_type *p_Var1;
  
  switch(this) {
  case (ContinuousAssignSyntax *)0x0:
    p_Var1 = (__index_type *)(__return_storage_ptr__ + 2);
    break;
  case (ContinuousAssignSyntax *)0x1:
    return __return_storage_ptr__ + 5;
  case (ContinuousAssignSyntax *)0x2:
    p_Var1 = *(__index_type **)
              &__return_storage_ptr__[6].
               super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>;
    break;
  case (ContinuousAssignSyntax *)0x3:
    p_Var1 = *(__index_type **)
              ((long)&__return_storage_ptr__[6].
                      super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                      super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                      super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                      .
                      super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                      .super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                      super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                      super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
              + 8);
    break;
  case (ContinuousAssignSyntax *)0x4:
    p_Var1 = (__index_type *)
             ((long)&__return_storage_ptr__[7].
                     super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
             + 8);
    break;
  case (ContinuousAssignSyntax *)0x5:
    return (PtrTokenOrSyntax *)
           (__index_type *)
           ((long)&__return_storage_ptr__[10].
                   super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
           + 8);
  default:
    return (PtrTokenOrSyntax *)0x0;
  }
  return (PtrTokenOrSyntax *)p_Var1;
}

Assistant:

PtrTokenOrSyntax ContinuousAssignSyntax::getChildPtr(size_t index) {
    switch (index) {
        case 0: return &attributes;
        case 1: return &assign;
        case 2: return strength;
        case 3: return delay;
        case 4: return &assignments;
        case 5: return &semi;
        default: return nullptr;
    }
}